

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

int defineAttribute(ELEMENT_TYPE *type,ATTRIBUTE_ID *attId,XML_Bool isCdata,XML_Bool isId,
                   XML_Char *value,XML_Parser parser)

{
  long *plVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  DEFAULT_ATTRIBUTE *pDVar5;
  undefined7 in_register_00000009;
  ulong uVar6;
  
  uVar2 = type->nDefaultAtts;
  if ((int)CONCAT71(in_register_00000009,isId) != 0 || value != (XML_Char *)0x0) {
    uVar6 = 0;
    if (0 < (int)uVar2) {
      uVar6 = (ulong)uVar2;
    }
    lVar4 = 0;
    while (uVar6 * 0x18 + 0x18 != lVar4 + 0x18) {
      plVar1 = (long *)((long)&type->defaultAtts->id + lVar4);
      lVar4 = lVar4 + 0x18;
      if ((ATTRIBUTE_ID *)*plVar1 == attId) {
        return 1;
      }
    }
    if (((isId != '\0') && (type->idAtt == (ATTRIBUTE_ID *)0x0)) && (attId->xmlns == '\0')) {
      type->idAtt = attId;
    }
  }
  if (uVar2 == type->allocDefaultAtts) {
    if (uVar2 == 0) {
      type->allocDefaultAtts = 8;
      pDVar5 = (DEFAULT_ATTRIBUTE *)(*(parser->m_mem).malloc_fcn)(0xc0);
      type->defaultAtts = pDVar5;
      if (pDVar5 == (DEFAULT_ATTRIBUTE *)0x0) {
        type->allocDefaultAtts = 0;
        return 0;
      }
    }
    else {
      pDVar5 = (DEFAULT_ATTRIBUTE *)
               (*(parser->m_mem).realloc_fcn)(type->defaultAtts,(long)(int)uVar2 * 0x30);
      if (pDVar5 == (DEFAULT_ATTRIBUTE *)0x0) {
        return 0;
      }
      type->allocDefaultAtts = uVar2 * 2;
      type->defaultAtts = pDVar5;
    }
  }
  else {
    pDVar5 = type->defaultAtts;
  }
  iVar3 = type->nDefaultAtts;
  pDVar5[iVar3].id = attId;
  pDVar5[iVar3].value = value;
  pDVar5[iVar3].isCdata = isCdata;
  if (isCdata == '\0') {
    attId->maybeTokenized = '\x01';
  }
  type->nDefaultAtts = iVar3 + 1;
  return 1;
}

Assistant:

static int
defineAttribute(ELEMENT_TYPE *type, ATTRIBUTE_ID *attId, XML_Bool isCdata,
                XML_Bool isId, const XML_Char *value, XML_Parser parser)
{
  DEFAULT_ATTRIBUTE *att;
  if (value || isId) {
    /* The handling of default attributes gets messed up if we have
       a default which duplicates a non-default. */
    int i;
    for (i = 0; i < type->nDefaultAtts; i++)
      if (attId == type->defaultAtts[i].id)
        return 1;
    if (isId && !type->idAtt && !attId->xmlns)
      type->idAtt = attId;
  }
  if (type->nDefaultAtts == type->allocDefaultAtts) {
    if (type->allocDefaultAtts == 0) {
      type->allocDefaultAtts = 8;
      type->defaultAtts = (DEFAULT_ATTRIBUTE *)MALLOC(parser, type->allocDefaultAtts
                            * sizeof(DEFAULT_ATTRIBUTE));
      if (!type->defaultAtts) {
        type->allocDefaultAtts = 0;
        return 0;
      }
    }
    else {
      DEFAULT_ATTRIBUTE *temp;
      int count = type->allocDefaultAtts * 2;
      temp = (DEFAULT_ATTRIBUTE *)
        REALLOC(parser, type->defaultAtts, (count * sizeof(DEFAULT_ATTRIBUTE)));
      if (temp == NULL)
        return 0;
      type->allocDefaultAtts = count;
      type->defaultAtts = temp;
    }
  }
  att = type->defaultAtts + type->nDefaultAtts;
  att->id = attId;
  att->value = value;
  att->isCdata = isCdata;
  if (!isCdata)
    attId->maybeTokenized = XML_TRUE;
  type->nDefaultAtts += 1;
  return 1;
}